

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

Node * __thiscall Assimp::ColladaLoader::FindNode(ColladaLoader *this,Node *pNode,string *pName)

{
  __type _Var1;
  Node *pNVar2;
  const_reference ppNVar3;
  Node *node;
  size_t a;
  string *pName_local;
  Node *pNode_local;
  ColladaLoader *this_local;
  
  _Var1 = std::operator==(&pNode->mName,pName);
  this_local = (ColladaLoader *)pNode;
  if ((!_Var1) && (_Var1 = std::operator==(&pNode->mID,pName), !_Var1)) {
    for (node = (Node *)0x0;
        pNVar2 = (Node *)std::
                         vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
                         size(&pNode->mChildren), node < pNVar2;
        node = (Node *)&(node->mName).field_0x1) {
      ppNVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
                operator[](&pNode->mChildren,(size_type)node);
      pNVar2 = FindNode(this,*ppNVar3,pName);
      if (pNVar2 != (Node *)0x0) {
        return pNVar2;
      }
    }
    this_local = (ColladaLoader *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}